

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O0

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
(anonymous_namespace)::runAckermannBuild(int,int,int,std::__cxx11::string_const&,std::__cxx11::
string_const&)::AckermannDelegate::lookupRule(llbuild::core::KeyType_const__
          (void *this,KeyType *keyData)

{
  pointer __p;
  KeyType *in_RDX;
  KeyType *keyData_local;
  AckermannDelegate *this_local;
  
  *(int *)&(keyData->key).field_2 = *(int *)&(keyData->key).field_2 + 1;
  __p = (pointer)operator_new(0x30);
  AckermannRule::AckermannRule(llbuild::core::KeyType_const__(__p,in_RDX);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,__p);
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<core::Rule> lookupRule(const core::KeyType& keyData) override {
      ++numRules;
      return std::unique_ptr<core::Rule>(new AckermannRule(keyData));
    }